

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O3

int __thiscall FormatTypeEDSK::GetNbRevolutions(FormatTypeEDSK *this,int side,int track)

{
  Track *pTVar1;
  Sector *pSVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  pTVar1 = this->side_[side].tracks;
  uVar6 = (ulong)pTVar1[track].nb_sector;
  if (uVar6 == 0) {
    uVar7 = 1;
  }
  else {
    pSVar2 = pTVar1[track].sectors;
    uVar7 = 1;
    lVar8 = 0;
    do {
      uVar4 = (uint)*(ushort *)(pSVar2->mfm_chrn + lVar8 + -0x12);
      uVar3 = 0x80 << (pSVar2->mfm_chrn[lVar8 + -0x15] & 0x1f);
      if (0x18 < pSVar2->mfm_chrn[lVar8 + -0x15]) {
        uVar3 = uVar4;
      }
      uVar5 = uVar4 / uVar3;
      if (uVar4 % uVar3 != 0) {
        uVar5 = 1;
      }
      if (uVar7 < uVar5) {
        uVar7 = uVar5;
      }
      *(uint *)(pSVar2->mfm_crc + lVar8 + 0x3c) = uVar5;
      lVar8 = lVar8 + 0x1d0;
    } while (uVar6 * 0x1d0 - lVar8 != 0);
  }
  return uVar7;
}

Assistant:

int FormatTypeEDSK::GetNbRevolutions(int side, int track)
{
   unsigned int nb_computed_revolution = 1;
   for (unsigned int s = 0; s < side_[side].tracks[track].nb_sector; s++)
   {
      // - n datas of sector (512 by default)
      unsigned int size_of_track = side_[side].tracks[track].sectors[s].actual_size;
      unsigned int theorical_size = (0x80 << (side_[side].tracks[track].sectors[s].sector_size));

      // Do we have multiple read ?
      if (theorical_size == 0) theorical_size = size_of_track;

      unsigned int nb_read = (size_of_track / theorical_size);

      if (size_of_track % theorical_size != 0)
         nb_read = 1;

      side_[side].tracks[track].sectors[s].nb_recorded_revolutions = nb_read;
      if (nb_read > nb_computed_revolution) nb_computed_revolution = nb_read;
   }
   return nb_computed_revolution;
}